

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_resampler_get_heap_size(ma_resampler_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ma_resampling_backend_vtable *pmVar2;
  void *pvVar3;
  
  if (pHeapSizeInBytes == (size_t *)0x0) {
    return MA_INVALID_ARGS;
  }
  *pHeapSizeInBytes = 0;
  if (pConfig == (ma_resampler_config *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pConfig->algorithm == ma_resample_algorithm_linear) {
    pmVar2 = &g_ma_linear_resampler_vtable;
    pvVar3 = (void *)0x0;
  }
  else {
    if (pConfig->algorithm != ma_resample_algorithm_custom) {
      return MA_INVALID_ARGS;
    }
    pmVar2 = pConfig->pBackendVTable;
    if (pmVar2 == (ma_resampling_backend_vtable *)0x0) {
      return MA_NOT_IMPLEMENTED;
    }
    pvVar3 = pConfig->pBackendUserData;
  }
  if (pmVar2->onGetHeapSize == (_func_ma_result_void_ptr_ma_resampler_config_ptr_size_t_ptr *)0x0) {
    return MA_NOT_IMPLEMENTED;
  }
  mVar1 = (*pmVar2->onGetHeapSize)(pvVar3,pConfig,pHeapSizeInBytes);
  return mVar1;
}

Assistant:

MA_API ma_result ma_resampler_get_heap_size(const ma_resampler_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_resampling_backend_vtable* pVTable;
    void* pVTableUserData;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_resampler_get_vtable(pConfig, NULL, &pVTable, &pVTableUserData);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pVTable == NULL || pVTable->onGetHeapSize == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pVTable->onGetHeapSize(pVTableUserData, pConfig, pHeapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}